

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::establishPotentialInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  string_view message;
  string_view commandStr_00;
  string_view target;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  Federate *pFVar4;
  element_type *peVar5;
  long in_RSI;
  long in_RDI;
  string commandStr;
  json establishInterfaces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *possibleFed;
  iterator __end2;
  iterator __begin2;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int logLevel;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc28;
  Federate *in_stack_fffffffffffffc30;
  undefined1 hexConvert;
  element_type *in_stack_fffffffffffffc38;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffc40;
  char (*in_stack_fffffffffffffc48) [20];
  Federate *in_stack_fffffffffffffc50;
  allocator<char> *in_stack_fffffffffffffc60;
  element_type *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  Federate *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  int iVar6;
  allocator<char> *paVar7;
  _func_int *p_Var8;
  ConnectionsList *in_stack_fffffffffffffcc8;
  Connector *in_stack_fffffffffffffcd0;
  undefined1 local_280 [32];
  __sv_type local_260;
  __sv_type local_250;
  __sv_type local_240;
  Federate *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  string *in_stack_fffffffffffffdf8;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *in_stack_fffffffffffffe00;
  json *in_stack_fffffffffffffe08;
  allocator<char> local_1e1 [40];
  allocator<char> local_1b9 [40];
  allocator<char> local_191 [33];
  format_args in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffea0;
  allocator<char> local_141 [17];
  ConnectionsList *in_stack_fffffffffffffed0;
  _Self local_e8;
  ConnectionsList *in_stack_ffffffffffffff38;
  Connector *in_stack_ffffffffffffff40;
  ConnectionsList *in_stack_ffffffffffffff48;
  Connector *in_stack_ffffffffffffff50;
  undefined8 local_88 [3];
  undefined8 local_70;
  undefined8 *local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 *local_50;
  char *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  scanPotentialInterfaces(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  scanPotentialInterfaceTemplates(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  scanUnconnectedInterfaces(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  scanUnknownInterfaces(in_stack_fffffffffffffed0);
  peVar3 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x268adc);
  p_Var8 = (peVar3->super_ValueFederate)._vptr_ValueFederate[-3];
  iVar2 = (**(code **)(*(long *)((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                                (long)p_Var8) + 0x48))
                    ((_func_int *)
                     ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate + (long)p_Var8),0x10f
                    );
  CLI::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(in_stack_fffffffffffffc28);
  CLI::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_fffffffffffffc28);
  while (bVar1 = CLI::std::operator==((_Self *)&stack0xffffffffffffff38,&local_e8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pFVar4 = (Federate *)
             CLI::std::
             _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                          *)&stack0xffffffffffffff38);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<const_char_(&)[20],_char[20],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(in_stack_fffffffffffffc40,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffc38);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffc30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 8)
              );
    addUsedPotentialInterfaceToCommand
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    std::allocator<char>::~allocator(local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 8)
              );
    addUsedPotentialInterfaceToCommand
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe97);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 8)
              );
    addUsedPotentialInterfaceToCommand
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    std::allocator<char>::~allocator(local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    peVar5 = CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                        (in_RDI + 8));
    p_Var8 = (_func_int *)0x0;
    if (peVar5 != (element_type *)0x0) {
      p_Var8 = (_func_int *)
               ((long)&(peVar5->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar5->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceTemplates
              (in_stack_fffffffffffffe08,
               (vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    std::allocator<char>::~allocator(local_1b9);
    in_stack_fffffffffffffc78 = (char *)(in_RSI + 0x318);
    paVar7 = local_1e1;
    in_stack_fffffffffffffc80 = pFVar4;
    iVar6 = iVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    in_stack_fffffffffffffc68 =
         CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                    (in_RDI + 8));
    in_stack_fffffffffffffc70 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (in_stack_fffffffffffffc68 != (element_type *)0x0) {
      in_stack_fffffffffffffc70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&(in_stack_fffffffffffffc68->super_ValueFederate)._vptr_ValueFederate +
           (long)(in_stack_fffffffffffffc68->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceTemplates
              (in_stack_fffffffffffffe08,
               (vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    std::allocator<char>::~allocator(local_1e1);
    in_stack_fffffffffffffc48 = (char (*) [20])(in_RSI + 0x330);
    in_stack_fffffffffffffc60 = (allocator<char> *)&stack0xfffffffffffffdf7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60
              );
    in_stack_fffffffffffffc38 =
         CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                    (in_RDI + 8));
    in_stack_fffffffffffffc40 =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    if (in_stack_fffffffffffffc38 != (element_type *)0x0) {
      in_stack_fffffffffffffc40 =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)((long)&(in_stack_fffffffffffffc38->super_ValueFederate)._vptr_ValueFederate +
              (long)(in_stack_fffffffffffffc38->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    addUsedPotentialInterfaceTemplates
              (in_stack_fffffffffffffe08,
               (vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    hexConvert = (undefined1)((ulong)in_stack_fffffffffffffc30 >> 0x38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdf7);
    fileops::generateJsonString((json *)in_stack_fffffffffffffc38,(bool)hexConvert);
    peVar3 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26918c);
    in_stack_fffffffffffffc30 =
         (Federate *)
         ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
         (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
    local_240 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc30);
    local_250 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc30);
    target._M_str = (char *)p_Var8;
    target._M_len = (size_t)peVar5;
    commandStr_00._M_len._4_4_ = iVar6;
    commandStr_00._M_len._0_4_ = in_stack_fffffffffffffc88;
    commandStr_00._M_str = (char *)paVar7;
    Federate::sendCommand
              (in_stack_fffffffffffffc80,target,commandStr_00,
               (HelicsSequencingModes)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    in_stack_fffffffffffffc50 = pFVar4;
    if (5 < iVar2) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x269223);
      in_stack_fffffffffffffc28 =
           (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
              (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      local_50 = (undefined8 *)(in_RDI + 0x1b0);
      local_38 = local_280;
      local_48 = "{} interfaces requested";
      local_40 = 0x17;
      local_60 = "{} interfaces requested";
      local_58 = 0x17;
      local_30 = *local_50;
      local_28 = local_88;
      local_18 = &local_70;
      local_20 = local_88;
      local_70 = 4;
      local_10 = local_30;
      local_8 = local_28;
      local_88[0] = local_30;
      local_68 = local_20;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffea0,in_stack_fffffffffffffe90);
      local_260 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc30);
      message._M_str = (char *)in_stack_fffffffffffffc40;
      message._M_len = (size_t)in_stack_fffffffffffffc38;
      Federate::logInfoMessage(in_stack_fffffffffffffc30,message);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc30);
      in_stack_fffffffffffffc50 = pFVar4;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc30);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffc30);
    CLI::std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)in_stack_fffffffffffffc30);
  }
  return;
}

Assistant:

void Connector::establishPotentialInterfaces(ConnectionsList& possibleConnections)
{
    scanPotentialInterfaces(possibleConnections);
    scanPotentialInterfaceTemplates(possibleConnections);

    /** now try to match unconnected interfaces to some of the potential ones*/
    scanUnconnectedInterfaces(possibleConnections);
    /** check for unknown interface connections to potential interfaces*/
    scanUnknownInterfaces(possibleConnections);

    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    for (auto& possibleFed : possibleConnections.federatesWithPotentialInterfaces) {
        nlohmann::json establishInterfaces;
        establishInterfaces["command"] = "register_interfaces";
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialInputs,
                                           possibleFed,
                                           logLevel,
                                           "inputs",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialPubs,
                                           possibleFed,
                                           logLevel,
                                           "publications",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialEndpoints,
                                           possibleFed,
                                           logLevel,
                                           "endpoints",
                                           fed.get());

        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialPublicationTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_publications",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialInputTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_inputs",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialEndpointTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_endpoints",
                                           fed.get());
        const std::string commandStr = fileops::generateJsonString(establishInterfaces);
        fed->sendCommand(possibleFed, commandStr);
        if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
            fed->logInfoMessage(fmt::format("{} interfaces requested", interfacesRequested));
        }
    }
}